

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QEasingCurve *item)

{
  QEasingCurvePrivate *pQVar1;
  Data *this;
  storage_type *in_RCX;
  QMetaObject *pQVar2;
  storage_type *psVar3;
  long *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QDebugStateSaver saver;
  QString local_c8;
  QString local_b0;
  QString local_98;
  QString local_80;
  QString local_68;
  QDebug local_50;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)item);
  pQVar1 = item->d_ptr;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"type:";
  QString::fromUtf8(&local_40,(QString *)0x5,ba);
  QTextStream::operator<<((QTextStream *)pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_50.stream = (Stream *)item->d_ptr;
  if ((local_50.stream)->space == true) {
    QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    local_50.stream = (Stream *)item->d_ptr;
  }
  (local_50.stream)->ref = (local_50.stream)->ref + 1;
  pQVar2 = &QEasingCurve::staticMetaObject;
  qt_QMetaEnum_debugOperator
            ((QDebug *)&local_68,(qint64)&local_50,(QMetaObject *)(ulong)*(uint *)*in_RDX,
             (char *)&QEasingCurve::staticMetaObject);
  this = local_68.d.d;
  ba_00.m_data = (storage_type *)pQVar2;
  ba_00.m_size = (qsizetype)"func:";
  QString::fromUtf8(&local_40,(QString *)0x5,ba_00);
  QTextStream::operator<<((QTextStream *)this,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&local_68.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
      '\x01') {
    QTextStream::operator<<((QTextStream *)local_68.d.d,' ');
  }
  QTextStream::operator<<((QTextStream *)local_68.d.d,*(void **)(*in_RDX + 0x10));
  if (*(char *)&local_68.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
      '\x01') {
    QTextStream::operator<<((QTextStream *)local_68.d.d,' ');
  }
  QDebug::~QDebug((QDebug *)&local_68);
  QDebug::~QDebug(&local_50);
  if (*(long *)(*in_RDX + 8) != 0) {
    ba_01.m_data = (storage_type *)pQVar2;
    ba_01.m_size = (qsizetype)"period:%1";
    QString::fromLatin1(&local_68,(QString *)0x9,ba_01);
    psVar3 = (storage_type *)0x66;
    QString::arg_impl(&local_40,&local_68,*(double *)(*(long *)(*in_RDX + 8) + 0x10),0,'f',0x14,
                      (QChar)0x20);
    if ((QChar *)local_40.d.ptr == (QChar *)0x0) {
      local_40.d.ptr = &QString::_empty;
    }
    QDebug::putString((QDebug *)item,(QChar *)local_40.d.ptr,local_40.d.size);
    if (*(char *)&item->d_ptr[2].type == '\x01') {
      QTextStream::operator<<((QTextStream *)item->d_ptr,' ');
    }
    ba_02.m_data = psVar3;
    ba_02.m_size = (qsizetype)"amp:%1";
    QString::fromLatin1(&local_98,(QString *)0x6,ba_02);
    psVar3 = (storage_type *)0x66;
    QString::arg_impl(&local_80,&local_98,*(double *)(*(long *)(*in_RDX + 8) + 0x18),0,'f',0x14,
                      (QChar)0x20);
    if ((QChar *)local_80.d.ptr == (QChar *)0x0) {
      local_80.d.ptr = &QString::_empty;
    }
    QDebug::putString((QDebug *)item,(QChar *)local_80.d.ptr,local_80.d.size);
    if (*(char *)&item->d_ptr[2].type == '\x01') {
      QTextStream::operator<<((QTextStream *)item->d_ptr,' ');
    }
    ba_03.m_data = psVar3;
    ba_03.m_size = (qsizetype)"overshoot:%1";
    QString::fromLatin1(&local_c8,(QString *)0xc,ba_03);
    QString::arg_impl(&local_b0,&local_c8,*(double *)(*(long *)(*in_RDX + 8) + 0x20),0,'f',0x14,
                      (QChar)0x20);
    if ((QChar *)local_b0.d.ptr == (QChar *)0x0) {
      local_b0.d.ptr = &QString::_empty;
    }
    QDebug::putString((QDebug *)item,(QChar *)local_b0.d.ptr,local_b0.d.size);
    if (*(char *)&item->d_ptr[2].type == '\x01') {
      QTextStream::operator<<((QTextStream *)item->d_ptr,' ');
    }
    if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = item->d_ptr;
  item->d_ptr = (QEasingCurvePrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QEasingCurve &item)
{
    QDebugStateSaver saver(debug);
    debug << "type:" << item.d_ptr->type
          << "func:" << reinterpret_cast<const void *>(item.d_ptr->func);
    if (item.d_ptr->config) {
        debug << QString::fromLatin1("period:%1").arg(item.d_ptr->config->_p, 0, 'f', 20)
              << QString::fromLatin1("amp:%1").arg(item.d_ptr->config->_a, 0, 'f', 20)
              << QString::fromLatin1("overshoot:%1").arg(item.d_ptr->config->_o, 0, 'f', 20);
    }
    return debug;
}